

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_data_writer.cpp
# Opt level: O2

void __thiscall
duckdb::OptimisticDataWriter::OptimisticDataWriter
          (OptimisticDataWriter *this,DataTable *table,OptimisticDataWriter *parent)

{
  pointer this_00;
  
  this->table = table;
  (this->partial_manager).
  super_unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartialBlockManager_*,_std::default_delete<duckdb::PartialBlockManager>_>
  .super__Head_base<0UL,_duckdb::PartialBlockManager_*,_false>._M_head_impl =
       (PartialBlockManager *)0x0;
  if ((parent->partial_manager).
      super_unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartialBlockManager_*,_std::default_delete<duckdb::PartialBlockManager>_>
      .super__Head_base<0UL,_duckdb::PartialBlockManager_*,_false>._M_head_impl !=
      (PartialBlockManager *)0x0) {
    this_00 = unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>,_true>
              ::operator->(&parent->partial_manager);
    PartialBlockManager::ClearBlocks(this_00);
  }
  return;
}

Assistant:

OptimisticDataWriter::OptimisticDataWriter(DataTable &table, OptimisticDataWriter &parent) : table(table) {
	if (parent.partial_manager) {
		parent.partial_manager->ClearBlocks();
	}
}